

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int inflate_block(BGZF *fp,int block_length)

{
  int iVar1;
  long local_90;
  z_stream zs;
  int block_length_local;
  BGZF *fp_local;
  
  zs.state = (internal_state *)0x0;
  zs.zalloc = (alloc_func)0x0;
  local_90 = (long)fp->compressed_block + 0x12;
  zs.next_in._0_4_ = block_length + -0x10;
  zs.total_in = (uLong)fp->uncompressed_block;
  zs.next_out._0_4_ = 0x10000;
  zs.reserved._4_4_ = block_length;
  iVar1 = inflateInit2_(&local_90,0xfffffff1,"1.2.11",0x70);
  if (iVar1 == 0) {
    iVar1 = inflate(&local_90,4);
    if (iVar1 == 1) {
      iVar1 = inflateEnd(&local_90);
      if (iVar1 == 0) {
        fp_local._4_4_ = zs.avail_out;
      }
      else {
        *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 1;
        fp_local._4_4_ = 0xffffffff;
      }
    }
    else {
      inflateEnd(&local_90);
      *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 1;
      fp_local._4_4_ = 0xffffffff;
    }
  }
  else {
    *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 1;
    fp_local._4_4_ = 0xffffffff;
  }
  return fp_local._4_4_;
}

Assistant:

static int inflate_block(BGZF* fp, int block_length)
{
    z_stream zs;
    zs.zalloc = NULL;
    zs.zfree = NULL;
    zs.next_in = (Bytef*)fp->compressed_block + 18;
    zs.avail_in = block_length - 16;
    zs.next_out = (Bytef*)fp->uncompressed_block;
    zs.avail_out = BGZF_MAX_BLOCK_SIZE;

    if (inflateInit2(&zs, -15) != Z_OK) {
        fp->errcode |= BGZF_ERR_ZLIB;
        return -1;
    }
    if (inflate(&zs, Z_FINISH) != Z_STREAM_END) {
        inflateEnd(&zs);
        fp->errcode |= BGZF_ERR_ZLIB;
        return -1;
    }
    if (inflateEnd(&zs) != Z_OK) {
        fp->errcode |= BGZF_ERR_ZLIB;
        return -1;
    }
    return zs.total_out;
}